

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.h
# Opt level: O1

void Parser::MapBindIdentifierFromElement<ByteCodeGenerator::StartEmitCatch(ParseNodeCatch*)::__0>
               (ParseNodePtr elementNode,anon_class_24_3_b926b611 handler)

{
  OpCode OVar1;
  Symbol *this;
  code *pcVar2;
  bool bVar3;
  ParseNodeBin *pPVar4;
  ParseNodeVar *pPVar5;
  undefined4 *puVar6;
  
  if (elementNode->nop == knopEllipsis) {
    pPVar4 = (ParseNodeBin *)ParseNode::AsParseNodeUni(elementNode);
LAB_00826992:
    elementNode = pPVar4->pnode1;
  }
  else if (elementNode->nop == knopAsg) {
    pPVar4 = ParseNode::AsParseNodeBin(elementNode);
    goto LAB_00826992;
  }
  OVar1 = elementNode->nop;
  if ((OVar1 & ~knopInt) == knopObjectPattern) {
    MapBindIdentifier<ByteCodeGenerator::StartEmitCatch(ParseNodeCatch*)::__0>(elementNode,handler);
    return;
  }
  if ((byte)(OVar1 + ~knopList) < 3) {
    pPVar5 = ParseNode::AsParseNodeVar(elementNode);
    this = pPVar5->sym;
    bVar3 = FuncInfo::IsGlobalFunction(*handler.funcInfo);
    if (bVar3) {
      this->field_0x43 = this->field_0x43 | 2;
    }
    if ((this->field_0x44 & 0x40) != 0) {
      Scope::SetIsObject(*handler.scope);
    }
    if (this->scopeSlot != -1) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0xfc0,"(sym->GetScopeSlot() == Js::Constants::NoProperty)",
                         "sym->GetScopeSlot() == Js::Constants::NoProperty");
      if (!bVar3) {
LAB_00826ad7:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
    bVar3 = Symbol::NeedsSlotAlloc(this,handler.this,*handler.funcInfo);
    if (bVar3) {
      Symbol::EnsureScopeSlot(this,handler.this,*handler.funcInfo);
      return;
    }
  }
  else if (OVar1 != knopEmpty) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/../Parser/Parse.h"
                       ,0x2dc,"(bindIdentNode->nop == knopEmpty)","Invalid bind identifier");
    if (!bVar3) goto LAB_00826ad7;
    *puVar6 = 0;
  }
  return;
}

Assistant:

static void MapBindIdentifierFromElement(ParseNodePtr elementNode, THandler handler)
    {
        ParseNodePtr bindIdentNode = elementNode;
        if (bindIdentNode->nop == knopAsg)
        {
            bindIdentNode = bindIdentNode->AsParseNodeBin()->pnode1;
        }
        else if (bindIdentNode->nop == knopEllipsis)
        {
            bindIdentNode = bindIdentNode->AsParseNodeUni()->pnode1;
        }

        if (bindIdentNode->IsPattern())
        {
            MapBindIdentifier(bindIdentNode, handler);
        }
        else if (bindIdentNode->IsVarLetOrConst())
        {
            handler(bindIdentNode);
        }
        else
        {
            AssertMsg(bindIdentNode->nop == knopEmpty, "Invalid bind identifier");
        }
    }